

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegenTest.cpp
# Opt level: O3

void __thiscall TestRegenerateCmakeHeader::Run(TestRegenerateCmakeHeader *this)

{
  int iVar1;
  runtime_error *this_00;
  bool bVar2;
  string expectedOutput;
  ostringstream oss;
  Configuration config;
  undefined1 *local_3e0;
  size_t local_3d8;
  undefined1 local_3d0 [16];
  undefined1 *local_3c0;
  size_t local_3b8;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [376];
  Configuration local_228;
  
  Configuration::Configuration(&local_228);
  std::__cxx11::string::_M_replace
            ((ulong)&local_228,0,(char *)local_228.companyName._M_string_length,0x12659b);
  std::__cxx11::string::_M_replace
            ((ulong)&local_228.licenseString,0,(char *)local_228.licenseString._M_string_length,
             0x1265a6);
  std::__cxx11::string::_M_replace
            ((ulong)&local_228.regenTag,0,(char *)local_228.regenTag._M_string_length,0x1265bc);
  local_3e0 = local_3d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3e0,
             "#\n# Copyright (c) My Company. All rights reserved.\n# My\n# multiline\n# license.\n#\n\n# AUTOGENERATED - do not edit, your changes will be lost\n# If you must edit, remove these two lines to avoid regeneration\n\n"
             ,"");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3a0);
  RegenerateCmakeHeader((ostream *)local_3a0,&local_228);
  std::__cxx11::stringbuf::str();
  if (local_3b8 == local_3d8) {
    if (local_3b8 == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(local_3c0,local_3e0,local_3b8);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if (local_3c0 != local_3b0) {
    operator_delete(local_3c0);
  }
  if (bVar2) {
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3a0);
    std::ios_base::~ios_base((ios_base *)(local_3a0 + 0x70));
    if (local_3e0 != local_3d0) {
      operator_delete(local_3e0);
    }
    Configuration::~Configuration(&local_228);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Assertion failed: oss.str() == expectedOutput");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TEST(RegenerateCmakeHeader) {
  Configuration config;
  config.companyName = "My Company";
  config.licenseString = "My\nmultiline\nlicense.";
  config.regenTag = "AUTOGENERATED";

  const std::string expectedOutput(
      "#\n"
      "# Copyright (c) My Company. All rights reserved.\n"
      "# My\n"
      "# multiline\n"
      "# license.\n"
      "#\n"
      "\n"
      "# AUTOGENERATED - do not edit, your changes will be lost\n"
      "# If you must edit, remove these two lines to avoid regeneration\n"
      "\n");

  std::ostringstream oss;
  RegenerateCmakeHeader(oss, config);

  ASSERT(oss.str() == expectedOutput);
}